

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managedheap.cpp
# Opt level: O3

BytePtr __thiscall stackjit::ManagedHeap::allocate(ManagedHeap *this,size_t size)

{
  BytePtr allocation;
  BytePtr puVar1;
  
  allocation = this->mNextAllocation;
  puVar1 = this->mNextAllocation + size;
  if (this->mData + (this->mSize - 1) < puVar1) {
    return (BytePtr)0x0;
  }
  this->mNextAllocation = puVar1;
  return allocation;
}

Assistant:

BytePtr ManagedHeap::allocate(std::size_t size) {
		auto nextAllocation = mNextAllocation + size;

		if (nextAllocation <= end()) {
			auto allocation = mNextAllocation;
			mNextAllocation = nextAllocation;
			return allocation;
		} else {
			return nullptr;
		}
	}